

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O3

int check_command(GlobalVars *gv,char *name,uint32_t flags)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  uint32_t *puVar5;
  
  if (ldCommands[0].name == (char *)0x0) {
    return 0;
  }
  puVar5 = &ldCommands[0].flags;
  pcVar4 = ldCommands[0].name;
  while (iVar2 = strcmp(pcVar4,name), pcVar4 = scriptname, iVar2 != 0) {
    pcVar4 = *(char **)(puVar5 + 4);
    puVar5 = puVar5 + 6;
    if (pcVar4 == (char *)0x0) {
      return 0;
    }
  }
  uVar3 = *puVar5;
  if ((uVar3 & flags) == 0) {
    if (-1 < (short)flags) {
      uVar3 = getlineno();
      error(0x6b,pcVar4,(ulong)uVar3,name);
      uVar3 = *puVar5;
    }
    if ((uVar3 >> 0xd & 1) != 0) {
      skipblock(0,'(',')');
      uVar3 = *puVar5;
    }
    if ((uVar3 >> 0xe & 1) == 0) {
      return 1;
    }
    do {
      cVar1 = getchr();
      if (cVar1 == ';') {
        return 1;
      }
    } while (cVar1 != '\0');
    return 1;
  }
  if (*(_func_void_GlobalVars_ptr **)(puVar5 + 2) != (_func_void_GlobalVars_ptr *)0x0) {
    (**(_func_void_GlobalVars_ptr **)(puVar5 + 2))(gv);
    return 1;
  }
  uVar3 = getlineno();
  error(0x45,pcVar4,(ulong)uVar3,name);
  if ((*puVar5 & 0x2000) == 0) {
    return 1;
  }
  skipblock(0,'(',')');
  return 1;
}

Assistant:

static int check_command(struct GlobalVars *gv,char *name,uint32_t flags)
{
  struct ScriptCmd *scptr;

  for (scptr=ldCommands; scptr->name; scptr++) {
    if (!strcmp(scptr->name,name))
      break;
  }

  if (scptr->name) {
    if (scptr->flags & flags) {
      if (scptr->cmdptr) {
        scptr->cmdptr(gv);  /* execute linker-script command */
      }
      else {
        error(69,scriptname,getlineno(),name);  /* command ignored */
        if (scptr->flags & SCMDF_PAREN)
          skipblock(0,'(',')');
      }
    }
    else {
      if (!(flags & SCMDF_IGNORE)) {
        /* command not allowed outside SECTIONS block */
        error(107,scriptname,getlineno(),name);
      }
      if (scptr->flags & SCMDF_PAREN)
        skipblock(0,'(',')');
      if (scptr->flags & SCMDF_SEMIC)
        skip_expr(0);
    }
    return 1;
  }

  return 0;
}